

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusGF.cpp
# Opt level: O2

void __thiscall ZXing::Pdf417::ModulusGF::ModulusGF(ModulusGF *this,int modulus,int generator)

{
  vector<short,_std::allocator<short>_> *this_00;
  pointer psVar1;
  vector<short,_std::allocator<short>_> *pvVar2;
  ulong uVar3;
  pointer psVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator_type local_55;
  int local_54;
  _Vector_base<int,_std::allocator<int>_> local_50;
  vector<short,_std::allocator<short>_> *local_38;
  
  this->_modulus = modulus;
  this_00 = &this->_expTable;
  local_38 = &this->_logTable;
  (this->_expTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_expTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_expTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_logTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_logTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_logTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_54 = 0;
  __l._M_len = 1;
  __l._M_array = &local_54;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_50,__l,&local_55);
  ModulusPoly::ModulusPoly(&this->_zero,this,(vector<int,_std::allocator<int>_> *)&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  local_54 = 1;
  __l_00._M_len = 1;
  __l_00._M_array = &local_54;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_50,__l_00,&local_55);
  ModulusPoly::ModulusPoly(&this->_one,this,(vector<int,_std::allocator<int>_> *)&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  local_50._M_impl.super__Vector_impl_data._M_start._0_2_ = 0;
  std::vector<short,_std::allocator<short>_>::resize
            (this_00,(long)(modulus * 2),(value_type_conflict4 *)&local_50);
  pvVar2 = local_38;
  local_50._M_impl.super__Vector_impl_data._M_start._0_2_ = 0;
  std::vector<short,_std::allocator<short>_>::resize
            (local_38,(long)modulus,(value_type_conflict4 *)&local_50);
  psVar4 = (this_00->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < modulus) {
    uVar7 = (ulong)(uint)modulus;
  }
  uVar3 = 1;
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    psVar4[uVar6] = (short)uVar3;
    uVar3 = (long)((int)uVar3 * generator) % (long)modulus & 0xffffffff;
  }
  uVar8 = modulus - 1;
  psVar4 = (this_00->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar5 = (long)(int)uVar8; lVar5 < modulus * 2; lVar5 = lVar5 + 1) {
    psVar4[(int)uVar8] = *psVar4;
    psVar4 = psVar4 + 1;
  }
  psVar4 = (this_00->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  psVar1 = (pvVar2->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  uVar6 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar6 = uVar7;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    psVar1[psVar4[uVar7]] = (short)uVar7;
  }
  return;
}

Assistant:

ModulusGF::ModulusGF(int modulus, int generator) :
	_modulus(modulus),
	_zero(*this, { 0 }),
	_one(*this, { 1 })
{
#ifdef ZX_REED_SOLOMON_USE_MORE_MEMORY_FOR_SPEED
	_expTable.resize(modulus * 2, 0);
#else
	_expTable.resize(modulus, 0);
#endif
	_logTable.resize(modulus, 0);
	int x = 1;
	for (int i = 0; i < modulus; i++) {
		_expTable[i] = x;
		x = (x * generator) % modulus;
	}

#ifdef ZX_REED_SOLOMON_USE_MORE_MEMORY_FOR_SPEED
	for (int i = modulus - 1; i < modulus * 2; ++i)
		_expTable[i] = _expTable[i - (modulus - 1)];
#endif

	for (int i = 0; i < modulus - 1; i++) {
		_logTable[_expTable[i]] = i;
	}
	// logTable[0] == 0 but this should never be used
}